

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64Module.c
# Opt level: O1

cs_err AArch64_global_init(cs_struct *ud)

{
  MCRegisterInfo *MRI;
  
  MRI = (MCRegisterInfo *)(*cs_mem_malloc)(0x58);
  AArch64_init(MRI);
  ud->printer = AArch64_printInst;
  ud->printer_info = MRI;
  ud->getinsn_info = MRI;
  ud->disasm = AArch64_getInstruction;
  ud->reg_name = AArch64_reg_name;
  ud->insn_id = AArch64_get_insn_id;
  ud->insn_name = AArch64_insn_name;
  ud->group_name = AArch64_group_name;
  ud->post_printer = AArch64_post_printer;
  ud->reg_access = AArch64_reg_access;
  return CS_ERR_OK;
}

Assistant:

cs_err AArch64_global_init(cs_struct *ud)
{
	MCRegisterInfo *mri;
	mri = cs_mem_malloc(sizeof(*mri));

	AArch64_init(mri);
	ud->printer = AArch64_printInst;
	ud->printer_info = mri;
	ud->getinsn_info = mri;
	ud->disasm = AArch64_getInstruction;
	ud->reg_name = AArch64_reg_name;
	ud->insn_id = AArch64_get_insn_id;
	ud->insn_name = AArch64_insn_name;
	ud->group_name = AArch64_group_name;
	ud->post_printer = AArch64_post_printer;
#ifndef CAPSTONE_DIET
	ud->reg_access = AArch64_reg_access;
#endif

	return CS_ERR_OK;
}